

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::CleanupCompaction(DBImpl *this,CompactionState *compact)

{
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *psVar1;
  void *in_RSI;
  long in_RDI;
  Output *out;
  size_t i;
  key_type *in_stack_ffffffffffffffb8;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  TableBuilder *this_01;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *local_18;
  
  port::Mutex::AssertHeld((Mutex *)(in_RDI + 0x8c8));
  if (*(long *)((long)in_RSI + 0x30) != 0) {
    TableBuilder::Abandon(*(TableBuilder **)((long)in_RSI + 0x30));
    this_01 = *(TableBuilder **)((long)in_RSI + 0x30);
    if (this_01 != (TableBuilder *)0x0) {
      TableBuilder::~TableBuilder(this_01);
      operator_delete(this_01,8);
    }
  }
  if (*(long **)((long)in_RSI + 0x28) != (long *)0x0) {
    (**(code **)(**(long **)((long)in_RSI + 0x28) + 8))();
  }
  local_18 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)0x0;
  while (this_00 = local_18,
        psVar1 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 std::
                 vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                 ::size((vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                         *)((long)in_RSI + 0x10)), this_00 < psVar1) {
    std::
    vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ::operator[]((vector<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                  *)((long)in_RSI + 0x10),(size_type)local_18);
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
              (this_00,in_stack_ffffffffffffffb8);
    local_18 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &(local_18->_M_t)._M_impl.field_0x1;
  }
  if (in_RSI != (void *)0x0) {
    CompactionState::~CompactionState((CompactionState *)0x1120a2);
    operator_delete(in_RSI,0x40);
  }
  return;
}

Assistant:

void DBImpl::CleanupCompaction(CompactionState* compact) {
  mutex_.AssertHeld();
  if (compact->builder != nullptr) {
    // May happen if we get a shutdown call in the middle of compaction
    compact->builder->Abandon();
    delete compact->builder;
  } else {
    assert(compact->outfile == nullptr);
  }
  delete compact->outfile;
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    const CompactionState::Output& out = compact->outputs[i];
    pending_outputs_.erase(out.number);
  }
  delete compact;
}